

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thetaneuron.cxx
# Opt level: O2

void __thiscall ThetaNeuron::ThetaNeuron(ThetaNeuron *this,Time *time,string *name,string *type)

{
  Time *pTVar1;
  ThetaMembrane *this_00;
  StochasticVariable *integrator;
  allocator<char> local_f4;
  allocator<char> local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  std::__cxx11::string::string((string *)&local_70,(string *)type);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron =
       (_func_int **)&PTR___cxa_pure_virtual_00157250;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ThetaNeuron_00157288;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__ThetaNeuron_00157320;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__ThetaNeuron_00157368;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"Differential Equation",(allocator<char> *)&local_b0);
  DifferentialEquation::DifferentialEquation
            (&this->thetaMembrane,time,3.1415926535,0.0,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::assign
            ((char *)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                      super_StochasticVariable.super_StochasticProcess.super_Physical.
                      physicalDescription);
  std::__cxx11::string::assign
            ((char *)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                      super_StochasticVariable.super_StochasticProcess.stochDescription);
  this_00 = (ThetaMembrane *)operator_new(0x148);
  pTVar1 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
           super_StochasticProcess.super_TimeDependent.xTime;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_f1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Theta Membrane",&local_f2)
  ;
  ThetaMembrane::ThetaMembrane(this_00,pTVar1,&local_d0,&local_f0);
  integrator = (StochasticVariable *)operator_new(0x148);
  pTVar1 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
           super_StochasticProcess.super_TimeDependent.xTime;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"t",&local_f3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Time Process",&local_f4);
  TimeProcess::TimeProcess((TimeProcess *)integrator,pTVar1,&local_90,&local_b0);
  DifferentialEquation::addTerm(&this->thetaMembrane,(StochasticFunction *)this_00,integrator);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

ThetaNeuron::ThetaNeuron(Time *time, const string& name, const string& type)
	: SpikingNeuron(time, name, type), thetaMembrane(time, 3.1415926535, 0.0)
{
	physicalDescription = "voltage";
	stochDescription = "theta neuron";
	thetaMembrane.addTerm( new ThetaMembrane(xTime), new TimeProcess(xTime) );
}